

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

SUNErrCode N_VConstVectorArray_Serial(int nvec,sunrealtype c,N_Vector *Z)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (nvec == 1) {
    N_VConst_Serial(c,*Z);
  }
  else {
    uVar2 = *(*Z)->content;
    uVar3 = 0;
    if ((long)uVar2 < 1) {
      uVar2 = uVar3;
    }
    uVar4 = (ulong)(uint)nvec;
    if (nvec < 1) {
      uVar4 = uVar3;
    }
    for (; uVar3 != uVar4; uVar3 = uVar3 + 1) {
      lVar1 = *(long *)((long)Z[uVar3]->content + 0x10);
      for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
        *(sunrealtype *)(lVar1 + uVar5 * 8) = c;
      }
    }
  }
  return 0;
}

Assistant:

SUNErrCode N_VConstVectorArray_Serial(int nvec, sunrealtype c, N_Vector* Z)
{
  SUNFunctionBegin(Z[0]->sunctx);
  int i;
  sunindextype j, N;
  sunrealtype* zd = NULL;

  /* invalid number of vectors */
  SUNAssert(nvec >= 1, SUN_ERR_ARG_OUTOFRANGE);

  /* should have called N_VConst */
  if (nvec == 1)
  {
    N_VConst_Serial(c, Z[0]);
    SUNCheckLastErr();
    return SUN_SUCCESS;
  }

  /* get vector length */
  N = NV_LENGTH_S(Z[0]);

  /* set each vector in the vector array to a constant */
  for (i = 0; i < nvec; i++)
  {
    zd = NV_DATA_S(Z[i]);
    for (j = 0; j < N; j++) { zd[j] = c; }
  }

  return SUN_SUCCESS;
}